

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::SetVectorStringView(Vector *vector,idx_t size,ArrowArray *array,idx_t current_pos)

{
  uint uVar1;
  undefined4 uVar2;
  data_ptr_t pdVar3;
  void *pvVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined4 *__src;
  ulong uVar10;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_50;
  Vector *local_48;
  ArrowArray *local_40;
  long local_38;
  
  if (size != 0) {
    pdVar3 = vector->data;
    pvVar4 = array->buffers[1];
    lVar8 = current_pos * 0x10;
    local_38 = (long)pvVar4 + lVar8 + 4;
    lVar9 = 0;
    uVar10 = 0;
    local_48 = vector;
    local_40 = array;
    do {
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)((long)pvVar4 + lVar9 + lVar8);
        if ((long)(int)uVar1 < 0xd) {
          __src = (undefined4 *)((long)pvVar4 + lVar9 + lVar8 + 0xc + -8);
          if (uVar1 < 0xd) {
            local_50 = 0;
            local_58 = 0;
            uStack_54 = 0;
            lVar7 = 0;
            if (uVar1 != 0) {
              switchD_012bc561::default(&local_58,__src,(long)(int)uVar1);
              lVar7 = CONCAT44(local_50,uStack_54);
              vector = local_48;
              array = local_40;
            }
          }
          else {
            lVar7 = local_38 + lVar9;
            local_58 = *__src;
          }
          local_50 = (undefined4)((ulong)lVar7 >> 0x20);
          uStack_54 = (undefined4)lVar7;
          *(uint *)(pdVar3 + lVar9) = uVar1;
          *(ulong *)(pdVar3 + lVar9 + 4) = CONCAT44(uStack_54,local_58);
          *(undefined4 *)(pdVar3 + lVar9 + 0xc) = local_50;
        }
        else {
          lVar7 = (long)*(int *)((long)pvVar4 + lVar9 + lVar8 + 0xc);
          pvVar6 = array->buffers[*(int *)((long)pvVar4 + lVar9 + lVar8 + 8) + 2];
          uVar2 = *(undefined4 *)((long)pvVar6 + lVar7);
          *(uint *)(pdVar3 + lVar9) = uVar1;
          *(undefined4 *)(pdVar3 + lVar9 + 4) = uVar2;
          *(long *)(pdVar3 + lVar9 + 8) = (long)pvVar6 + lVar7;
        }
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (size != uVar10);
  }
  return;
}

Assistant:

static void SetVectorStringView(Vector &vector, idx_t size, ArrowArray &array, idx_t current_pos) {
	auto strings = FlatVector::GetData<string_t>(vector);
	auto arrow_string = ArrowBufferData<arrow_string_view_t>(array, 1) + current_pos;

	for (idx_t row_idx = 0; row_idx < size; row_idx++) {
		if (FlatVector::IsNull(vector, row_idx)) {
			continue;
		}
		auto length = UnsafeNumericCast<uint32_t>(arrow_string[row_idx].Length());
		if (arrow_string[row_idx].IsInline()) {
			//	This string is inlined
			//  | Bytes 0-3  | Bytes 4-15                            |
			//  |------------|---------------------------------------|
			//  | length     | data (padded with 0)                  |
			strings[row_idx] = string_t(arrow_string[row_idx].GetInlineData(), length);
		} else {
			//  This string is not inlined, we have to check a different buffer and offsets
			//  | Bytes 0-3  | Bytes 4-7  | Bytes 8-11 | Bytes 12-15 |
			//  |------------|------------|------------|-------------|
			//  | length     | prefix     | buf. index | offset      |
			auto buffer_index = UnsafeNumericCast<uint32_t>(arrow_string[row_idx].GetBufferIndex());
			int32_t offset = arrow_string[row_idx].GetOffset();
			D_ASSERT(array.n_buffers > 2 + buffer_index);
			auto c_data = ArrowBufferData<char>(array, 2 + buffer_index);
			strings[row_idx] = string_t(&c_data[offset], length);
		}
	}
}